

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_attributes_uint8(void *a,uint8_t **attrib)

{
  int *__src;
  uint compressedSize;
  long lVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  char *source;
  int iVar5;
  ulong __size;
  
  iVar5 = 0;
  iVar4 = 0;
  if ((*(int *)((long)a + 0x24) == 0x11) && (iVar4 = iVar5, *(int *)((long)a + 0x40) == 0)) {
    lVar1 = *(long *)((long)a + 0x10);
    piVar2 = *(int **)((long)a + 0x18);
    uVar3 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)piVar2 + (4 - lVar1)) <= uVar3) {
      iVar5 = *piVar2;
      *(int **)((long)a + 0x18) = piVar2 + 1;
      if ((ulong)((long)(piVar2 + 1) + (4 - lVar1)) <= uVar3) {
        compressedSize = piVar2[1];
        __size = (ulong)compressedSize;
        __src = piVar2 + 2;
        *(int **)((long)a + 0x18) = __src;
        source = (char *)malloc(__size);
        if ((long)piVar2 + ((__size + 8) - lVar1) <= uVar3) {
          memcpy(source,__src,__size);
          *(ulong *)((long)a + 0x18) = (long)__src + __size;
          if (attrib != (uint8_t **)0x0) {
            iVar4 = LZ4_decompress_safe(source,(char *)attrib,compressedSize,iVar5);
            if (iVar4 != iVar5) {
              __assert_fail("bytes_decompressed == nr_of_attribs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x5a0,"int trico_read_attributes_uint8(void *, uint8_t **)");
            }
          }
          free(source);
          read_next_stream_type((trico_archive *)a);
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int trico_read_attributes_uint8(void* a, uint8_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint8_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;

  if (attrib != NULL)
    {
    uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)attrib, nr_of_compressed_bytes, nr_of_attribs);
    assert(bytes_decompressed == nr_of_attribs);
    (void)bytes_decompressed; //suppress warning
    }

  trico_free(compressed);  

  read_next_stream_type(arch);

  return 1;
  }